

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_soft_max_ext_back(ggml_compute_params *params,ggml_tensor *dst)

{
  int *piVar1;
  uint *puVar2;
  int iVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  size_t sVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  byte bVar20;
  byte bVar21;
  char cVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  void *pvVar26;
  int i;
  ulong uVar27;
  char *pcVar28;
  long lVar29;
  float *x;
  long lVar30;
  undefined8 uVar31;
  long lVar32;
  float *y;
  ushort uVar33;
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  float local_15c;
  int64_t local_158;
  uint local_14c;
  undefined1 local_148 [16];
  long local_130;
  ulong local_128;
  ggml_tensor *local_120;
  ulong local_118;
  ggml_tensor *local_110;
  ggml_tensor *local_108;
  void *local_100;
  undefined1 local_f8 [64];
  undefined1 local_b8 [64];
  undefined1 local_78 [64];
  
  pgVar4 = dst->src[0];
  if (pgVar4->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x12f9,"fatal error");
  }
  pgVar5 = dst->src[1];
  cVar22 = ggml_is_contiguous(pgVar4);
  if (cVar22 == '\0') {
    pcVar28 = "ggml_is_contiguous(src0)";
    uVar31 = 0x129f;
  }
  else {
    cVar22 = ggml_is_contiguous(pgVar5);
    if (cVar22 == '\0') {
      pcVar28 = "ggml_is_contiguous(src1)";
      uVar31 = 0x12a0;
    }
    else {
      cVar22 = ggml_is_contiguous(dst);
      if (cVar22 == '\0') {
        pcVar28 = "ggml_is_contiguous(dst)";
        uVar31 = 0x12a1;
      }
      else {
        cVar22 = ggml_are_same_shape(pgVar4,dst);
        if (cVar22 == '\0') {
          pcVar28 = "ggml_are_same_shape(src0, dst)";
          uVar31 = 0x12a2;
        }
        else {
          cVar22 = ggml_are_same_shape(pgVar5,dst);
          if (cVar22 == '\0') {
            pcVar28 = "ggml_are_same_shape(src1, dst)";
            uVar31 = 0x12a3;
          }
          else {
            local_108 = pgVar5;
            if (((float)dst->op_params[1] == 0.0) && (!NAN((float)dst->op_params[1]))) {
              local_158 = pgVar4->ne[0];
              iVar3 = params->ith;
              iVar24 = params->nth;
              local_148 = ZEXT416((uint)dst->op_params[0]);
              local_110 = dst;
              uVar23 = ggml_nrows(pgVar4);
              iVar24 = (int)(iVar24 + -1 + uVar23) / iVar24;
              lVar30 = (long)iVar3 * (long)iVar24;
              uVar25 = iVar24 + (int)lVar30;
              if ((int)uVar23 <= (int)uVar25) {
                uVar25 = uVar23;
              }
              local_118 = (ulong)uVar25;
              if ((int)lVar30 < (int)uVar25) {
                auVar34 = vpbroadcastd_avx512f(ZEXT416((uint)local_148._0_4_));
                uVar25 = (uint)local_158;
                local_14c = uVar25 & 0xffffffc0;
                lVar29 = (long)(int)local_14c;
                lVar32 = (long)(int)uVar25;
                if ((long)(int)uVar25 < lVar29 + 1) {
                  lVar32 = lVar29 + 1;
                }
                local_78 = vmovdqu64_avx512f(auVar34);
                auVar34 = vpbroadcastq_avx512f();
                local_130 = lVar29 << 2;
                local_b8 = vmovdqu64_avx512f(auVar34);
                auVar34 = vpbroadcastq_avx512f();
                local_128 = (lVar32 - lVar29) + 0xfU & 0xfffffffffffffff0;
                local_f8 = vmovdqu64_avx512f(auVar34);
                local_120 = pgVar4;
                do {
                  local_148._0_8_ = lVar30;
                  y = (float *)(local_120->nb[1] * lVar30 + (long)local_120->data);
                  sVar6 = local_110->nb[1];
                  x = (float *)(local_108->nb[1] * lVar30 + (long)local_108->data);
                  local_100 = local_110->data;
                  local_15c = 0.0;
                  ggml_vec_dot_f32((int)local_158,&local_15c,0,x,0,y,0,1);
                  auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                  auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                  auVar36 = vmovdqu64_avx512f(local_b8);
                  if (0 < (int)(uint)local_158) {
                    lVar30 = sVar6 * local_148._0_8_;
                    uVar27 = 0;
                    do {
                      *(float *)((long)local_100 + uVar27 * 4 + lVar30) = y[uVar27];
                      uVar27 = uVar27 + 1;
                    } while ((uVar25 & 0x7fffffff) != uVar27);
                    auVar37 = vbroadcastss_avx512f(ZEXT416((uint)local_15c));
                    uVar27 = 0;
                    do {
                      auVar38 = vpbroadcastq_avx512f();
                      auVar39 = vporq_avx512f(auVar38,auVar35);
                      auVar38 = vporq_avx512f(auVar38,auVar34);
                      uVar31 = vpcmpuq_avx512f(auVar38,auVar36,2);
                      bVar20 = (byte)uVar31;
                      uVar31 = vpcmpuq_avx512f(auVar39,auVar36,2);
                      bVar21 = (byte)uVar31;
                      uVar33 = CONCAT11(bVar21,bVar20);
                      piVar1 = (int *)((long)local_100 + uVar27 * 4 + lVar30);
                      auVar38._4_4_ = (uint)((byte)(uVar33 >> 1) & 1) * piVar1[1];
                      auVar38._0_4_ = (uint)(bVar20 & 1) * *piVar1;
                      auVar38._8_4_ = (uint)((byte)(uVar33 >> 2) & 1) * piVar1[2];
                      auVar38._12_4_ = (uint)((byte)(uVar33 >> 3) & 1) * piVar1[3];
                      auVar38._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * piVar1[4];
                      auVar38._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * piVar1[5];
                      auVar38._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * piVar1[6];
                      auVar38._28_4_ = (uint)((byte)(uVar33 >> 7) & 1) * piVar1[7];
                      auVar38._32_4_ = (uint)(bVar21 & 1) * piVar1[8];
                      auVar38._36_4_ = (uint)(bVar21 >> 1 & 1) * piVar1[9];
                      auVar38._40_4_ = (uint)(bVar21 >> 2 & 1) * piVar1[10];
                      auVar38._44_4_ = (uint)(bVar21 >> 3 & 1) * piVar1[0xb];
                      auVar38._48_4_ = (uint)(bVar21 >> 4 & 1) * piVar1[0xc];
                      auVar38._52_4_ = (uint)(bVar21 >> 5 & 1) * piVar1[0xd];
                      auVar38._56_4_ = (uint)(bVar21 >> 6 & 1) * piVar1[0xe];
                      auVar38._60_4_ = (uint)(bVar21 >> 7) * piVar1[0xf];
                      auVar38 = vsubps_avx512f(auVar38,auVar37);
                      puVar2 = (uint *)((long)local_100 + uVar27 * 4 + lVar30);
                      bVar7 = (bool)((byte)(uVar33 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar33 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar33 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar33 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar33 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar33 >> 6) & 1);
                      bVar13 = (bool)((byte)(uVar33 >> 7) & 1);
                      bVar14 = (bool)(bVar21 >> 1 & 1);
                      bVar15 = (bool)(bVar21 >> 2 & 1);
                      bVar16 = (bool)(bVar21 >> 3 & 1);
                      bVar17 = (bool)(bVar21 >> 4 & 1);
                      bVar18 = (bool)(bVar21 >> 5 & 1);
                      bVar19 = (bool)(bVar21 >> 6 & 1);
                      *puVar2 = (uint)(bVar20 & 1) * auVar38._0_4_ |
                                (uint)!(bool)(bVar20 & 1) * *puVar2;
                      puVar2[1] = (uint)bVar7 * auVar38._4_4_ | (uint)!bVar7 * puVar2[1];
                      puVar2[2] = (uint)bVar8 * auVar38._8_4_ | (uint)!bVar8 * puVar2[2];
                      puVar2[3] = (uint)bVar9 * auVar38._12_4_ | (uint)!bVar9 * puVar2[3];
                      puVar2[4] = (uint)bVar10 * auVar38._16_4_ | (uint)!bVar10 * puVar2[4];
                      puVar2[5] = (uint)bVar11 * auVar38._20_4_ | (uint)!bVar11 * puVar2[5];
                      puVar2[6] = (uint)bVar12 * auVar38._24_4_ | (uint)!bVar12 * puVar2[6];
                      puVar2[7] = (uint)bVar13 * auVar38._28_4_ | (uint)!bVar13 * puVar2[7];
                      puVar2[8] = (uint)(bVar21 & 1) * auVar38._32_4_ |
                                  (uint)!(bool)(bVar21 & 1) * puVar2[8];
                      puVar2[9] = (uint)bVar14 * auVar38._36_4_ | (uint)!bVar14 * puVar2[9];
                      puVar2[10] = (uint)bVar15 * auVar38._40_4_ | (uint)!bVar15 * puVar2[10];
                      puVar2[0xb] = (uint)bVar16 * auVar38._44_4_ | (uint)!bVar16 * puVar2[0xb];
                      puVar2[0xc] = (uint)bVar17 * auVar38._48_4_ | (uint)!bVar17 * puVar2[0xc];
                      puVar2[0xd] = (uint)bVar18 * auVar38._52_4_ | (uint)!bVar18 * puVar2[0xd];
                      puVar2[0xe] = (uint)bVar19 * auVar38._56_4_ | (uint)!bVar19 * puVar2[0xe];
                      puVar2[0xf] = (uint)(bVar21 >> 7) * auVar38._60_4_ |
                                    (uint)!(bool)(bVar21 >> 7) * puVar2[0xf];
                      uVar27 = uVar27 + 0x10;
                    } while ((uVar25 + 0xf & 0xfffffff0) != uVar27);
                    uVar27 = 0;
                    do {
                      *(float *)((long)local_100 + uVar27 * 4 + lVar30) =
                           *(float *)((long)local_100 + uVar27 * 4 + lVar30) * x[uVar27];
                      uVar27 = uVar27 + 1;
                    } while ((uVar25 & 0x7fffffff) != uVar27);
                  }
                  auVar36 = vmovdqu64_avx512f(local_f8);
                  if (0 < (int)local_14c) {
                    uVar27 = 0;
                    pvVar26 = (void *)(sVar6 * local_148._0_8_ + (long)local_100);
                    do {
                      lVar30 = 0;
                      do {
                        auVar37 = vmulps_avx512f(local_78,*(undefined1 (*) [64])
                                                           ((long)pvVar26 + lVar30));
                        *(undefined1 (*) [64])((long)pvVar26 + lVar30) = auVar37;
                        lVar30 = lVar30 + 0x40;
                      } while (lVar30 != 0x100);
                      uVar27 = uVar27 + 0x40;
                      pvVar26 = (void *)((long)pvVar26 + 0x100);
                    } while (uVar27 < (uVar25 & 0xffffffc0));
                  }
                  if (local_14c != (uint)local_158) {
                    uVar27 = 0;
                    lVar30 = sVar6 * local_148._0_8_ + local_130;
                    do {
                      auVar37 = vpbroadcastq_avx512f();
                      auVar38 = vporq_avx512f(auVar37,auVar35);
                      auVar37 = vporq_avx512f(auVar37,auVar34);
                      uVar31 = vpcmpuq_avx512f(auVar37,auVar36,2);
                      bVar20 = (byte)uVar31;
                      uVar31 = vpcmpuq_avx512f(auVar38,auVar36,2);
                      bVar21 = (byte)uVar31;
                      uVar33 = CONCAT11(bVar21,bVar20);
                      piVar1 = (int *)((long)local_100 + uVar27 * 4 + lVar30);
                      auVar37._4_4_ = (uint)((byte)(uVar33 >> 1) & 1) * piVar1[1];
                      auVar37._0_4_ = (uint)(bVar20 & 1) * *piVar1;
                      auVar37._8_4_ = (uint)((byte)(uVar33 >> 2) & 1) * piVar1[2];
                      auVar37._12_4_ = (uint)((byte)(uVar33 >> 3) & 1) * piVar1[3];
                      auVar37._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * piVar1[4];
                      auVar37._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * piVar1[5];
                      auVar37._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * piVar1[6];
                      auVar37._28_4_ = (uint)((byte)(uVar33 >> 7) & 1) * piVar1[7];
                      auVar37._32_4_ = (uint)(bVar21 & 1) * piVar1[8];
                      auVar37._36_4_ = (uint)(bVar21 >> 1 & 1) * piVar1[9];
                      auVar37._40_4_ = (uint)(bVar21 >> 2 & 1) * piVar1[10];
                      auVar37._44_4_ = (uint)(bVar21 >> 3 & 1) * piVar1[0xb];
                      auVar37._48_4_ = (uint)(bVar21 >> 4 & 1) * piVar1[0xc];
                      auVar37._52_4_ = (uint)(bVar21 >> 5 & 1) * piVar1[0xd];
                      auVar37._56_4_ = (uint)(bVar21 >> 6 & 1) * piVar1[0xe];
                      auVar37._60_4_ = (uint)(bVar21 >> 7) * piVar1[0xf];
                      auVar37 = vmulps_avx512f(local_78,auVar37);
                      puVar2 = (uint *)((long)local_100 + uVar27 * 4 + lVar30);
                      bVar7 = (bool)((byte)(uVar33 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar33 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar33 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar33 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar33 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar33 >> 6) & 1);
                      bVar13 = (bool)((byte)(uVar33 >> 7) & 1);
                      bVar14 = (bool)(bVar21 >> 1 & 1);
                      bVar15 = (bool)(bVar21 >> 2 & 1);
                      bVar16 = (bool)(bVar21 >> 3 & 1);
                      bVar17 = (bool)(bVar21 >> 4 & 1);
                      bVar18 = (bool)(bVar21 >> 5 & 1);
                      bVar19 = (bool)(bVar21 >> 6 & 1);
                      *puVar2 = (uint)(bVar20 & 1) * auVar37._0_4_ |
                                (uint)!(bool)(bVar20 & 1) * *puVar2;
                      puVar2[1] = (uint)bVar7 * auVar37._4_4_ | (uint)!bVar7 * puVar2[1];
                      puVar2[2] = (uint)bVar8 * auVar37._8_4_ | (uint)!bVar8 * puVar2[2];
                      puVar2[3] = (uint)bVar9 * auVar37._12_4_ | (uint)!bVar9 * puVar2[3];
                      puVar2[4] = (uint)bVar10 * auVar37._16_4_ | (uint)!bVar10 * puVar2[4];
                      puVar2[5] = (uint)bVar11 * auVar37._20_4_ | (uint)!bVar11 * puVar2[5];
                      puVar2[6] = (uint)bVar12 * auVar37._24_4_ | (uint)!bVar12 * puVar2[6];
                      puVar2[7] = (uint)bVar13 * auVar37._28_4_ | (uint)!bVar13 * puVar2[7];
                      puVar2[8] = (uint)(bVar21 & 1) * auVar37._32_4_ |
                                  (uint)!(bool)(bVar21 & 1) * puVar2[8];
                      puVar2[9] = (uint)bVar14 * auVar37._36_4_ | (uint)!bVar14 * puVar2[9];
                      puVar2[10] = (uint)bVar15 * auVar37._40_4_ | (uint)!bVar15 * puVar2[10];
                      puVar2[0xb] = (uint)bVar16 * auVar37._44_4_ | (uint)!bVar16 * puVar2[0xb];
                      puVar2[0xc] = (uint)bVar17 * auVar37._48_4_ | (uint)!bVar17 * puVar2[0xc];
                      puVar2[0xd] = (uint)bVar18 * auVar37._52_4_ | (uint)!bVar18 * puVar2[0xd];
                      puVar2[0xe] = (uint)bVar19 * auVar37._56_4_ | (uint)!bVar19 * puVar2[0xe];
                      puVar2[0xf] = (uint)(bVar21 >> 7) * auVar37._60_4_ |
                                    (uint)!(bool)(bVar21 >> 7) * puVar2[0xf];
                      uVar27 = uVar27 + 0x10;
                    } while (local_128 != uVar27);
                  }
                  lVar30 = local_148._0_8_ + 1;
                } while ((int)local_118 != (int)lVar30);
              }
              return;
            }
            pcVar28 = "max_bias == 0.0f";
            uVar31 = 0x12ab;
          }
        }
      }
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar31,"GGML_ASSERT(%s) failed",pcVar28);
}

Assistant:

void ggml_compute_forward_soft_max_ext_back(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_soft_max_ext_back_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}